

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsidebar.cpp
# Opt level: O3

void __thiscall
QSidebar::setModelAndUrls(QSidebar *this,QFileSystemModel *model,QList<QUrl> *newUrls)

{
  QUrlModel *this_00;
  QStyledItemDelegate *this_01;
  QItemSelectionModel *pQVar1;
  undefined4 *puVar2;
  QAbstractItemModel *pQVar3;
  long in_FS_OFFSET;
  code *local_78;
  ImplFn local_70;
  undefined8 uStack_68;
  code *local_60;
  quintptr local_58;
  QObject local_48 [8];
  QObject local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QListView::setUniformItemSizes(&this->super_QListView,true);
  this_00 = (QUrlModel *)operator_new(0x68);
  QUrlModel::QUrlModel(this_00,(QObject *)this);
  this->urlModel = this_00;
  QUrlModel::setFileSystemModel(this_00,model);
  (**(code **)(*(long *)&(this->super_QListView).super_QAbstractItemView.super_QAbstractScrollArea.
                         super_QFrame.super_QWidget + 0x1c8))(this,this->urlModel);
  this_01 = (QStyledItemDelegate *)operator_new(0x10);
  QStyledItemDelegate::QStyledItemDelegate(this_01,(QObject *)this);
  *(undefined ***)this_01 = &PTR_metaObject_00803048;
  QAbstractItemView::setItemDelegate((QAbstractItemView *)this,(QAbstractItemDelegate *)this_01);
  pQVar1 = QAbstractItemView::selectionModel((QAbstractItemView *)this);
  local_78 = clicked;
  local_70 = (ImplFn)0x0;
  local_60 = QItemSelectionModel::currentChanged;
  local_58 = 0;
  puVar2 = (undefined4 *)operator_new(0x20);
  *puVar2 = 1;
  *(code **)(puVar2 + 2) =
       QtPrivate::
       QCallableObject<void_(QSidebar::*)(const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&>,_void>
       ::impl;
  *(code **)(puVar2 + 4) = clicked;
  *(undefined8 *)(puVar2 + 6) = 0;
  QObject::connectImpl
            (local_40,(void **)pQVar1,(QObject *)&local_60,(void **)this,
             (QSlotObjectBase *)&local_78,(ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  QAbstractItemView::setDragDropMode((QAbstractItemView *)this,DragDrop);
  QWidget::setContextMenuPolicy((QWidget *)this,CustomContextMenu);
  local_78 = showContextMenu;
  local_70 = (ImplFn)0x0;
  local_60 = QWidget::customContextMenuRequested;
  local_58 = 0;
  puVar2 = (undefined4 *)operator_new(0x20);
  *puVar2 = 1;
  *(code **)(puVar2 + 2) =
       QtPrivate::
       QCallableObject<void_(QSidebar::*)(const_QPoint_&),_QtPrivate::List<const_QPoint_&>,_void>::
       impl;
  *(code **)(puVar2 + 4) = showContextMenu;
  *(undefined8 *)(puVar2 + 6) = 0;
  QObject::connectImpl
            (local_48,(void **)this,(QObject *)&local_60,(void **)this,(QSlotObjectBase *)&local_78,
             (ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  QUrlModel::setUrls(this->urlModel,newUrls);
  pQVar3 = QAbstractItemView::model((QAbstractItemView *)this);
  local_78 = (code *)0xffffffffffffffff;
  local_70 = (ImplFn)0x0;
  uStack_68 = 0;
  (**(code **)(*(long *)pQVar3 + 0x60))((QModelIndex *)&local_60,pQVar3,0,0,&local_78);
  QAbstractItemView::setCurrentIndex((QAbstractItemView *)this,(QModelIndex *)&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSidebar::setModelAndUrls(QFileSystemModel *model, const QList<QUrl> &newUrls)
{
    setUniformItemSizes(true);
    urlModel = new QUrlModel(this);
    urlModel->setFileSystemModel(model);
    setModel(urlModel);
    setItemDelegate(new QSideBarDelegate(this));

    connect(selectionModel(), &QItemSelectionModel::currentChanged,
            this, &QSidebar::clicked);
#if QT_CONFIG(draganddrop)
    setDragDropMode(QAbstractItemView::DragDrop);
#endif
#if QT_CONFIG(menu)
    setContextMenuPolicy(Qt::CustomContextMenu);
    connect(this, &QSidebar::customContextMenuRequested,
            this, &QSidebar::showContextMenu);
#endif
    urlModel->setUrls(newUrls);
    setCurrentIndex(this->model()->index(0,0));
}